

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_compress_fast_force
              (char *source,char *dest,int inputSize,int maxOutputSize,int acceleration)

{
  short sVar1;
  char cVar2;
  BYTE *d;
  char *pcVar3;
  int *piVar4;
  long *plVar5;
  uint uVar6;
  long *plVar7;
  int *piVar8;
  char cVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  BYTE *e_1;
  long *plVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  char *pcVar19;
  BYTE *e;
  long *plVar20;
  char *pcVar21;
  int local_4078;
  LZ4_stream_t ctx;
  
  memset(&ctx,0,0x4020);
  pcVar3 = dest + maxOutputSize;
  iVar10 = (int)source;
  local_4078 = (int)dest;
  if (inputSize < 0x1000b) {
    iVar18 = 0;
    if ((uint)inputSize < 0x7e000001) {
      plVar13 = (long *)source;
      pcVar19 = dest;
      if (0xc < (uint)inputSize) {
        plVar5 = (long *)source;
        do {
          uVar15 = 1;
          lVar11 = *(long *)((long)plVar5 + 1);
          plVar7 = (long *)((long)plVar5 + 1);
          uVar14 = acceleration << 6;
          do {
            plVar20 = plVar7;
            plVar7 = (long *)(uVar15 + (long)plVar20);
            plVar13 = plVar5;
            if (source + (long)inputSize + -0xc < plVar7) goto LAB_001681b7;
            uVar15 = (ulong)(uVar14 >> 6);
            uVar14 = uVar14 + 1;
            uVar12 = (ulong)((uint)((ulong)(lVar11 * 0xcf1bbcdcbb) >> 0x1b) & 0x1fff);
            uVar17 = (ulong)*(ushort *)((long)ctx.table + uVar12 * 2);
            lVar11 = *plVar7;
            sVar1 = (short)source;
            *(short *)((long)ctx.table + uVar12 * 2) = (short)plVar20 - sVar1;
          } while (*(int *)(source + uVar17) != (int)*plVar20);
          lVar11 = 0;
          cVar2 = (char)plVar20 * '\x10' + (char)plVar5 * -0x10;
          do {
            cVar9 = cVar2;
            lVar16 = lVar11;
            piVar4 = (int *)(source + lVar16 + uVar17);
            plVar13 = (long *)((long)plVar20 + lVar16);
            if ((plVar13 <= plVar5) || (piVar4 <= source)) break;
            lVar11 = lVar16 + -1;
            cVar2 = cVar9 + -0x10;
          } while (*(char *)((long)plVar20 + lVar16 + -1) == source[lVar16 + (uVar17 - 1)]);
          uVar14 = (int)plVar20 - (int)plVar5;
          uVar17 = (ulong)(uVar14 + (int)lVar16);
          uVar15 = (ulong)uVar14 + lVar16;
          if (pcVar3 < pcVar19 + (uVar15 & 0xffffffff) / 0xff + uVar17 + 9) {
            return 0;
          }
          if ((uint)uVar15 < 0xf) {
            plVar7 = (long *)(pcVar19 + 1);
            *pcVar19 = cVar9;
          }
          else {
            *pcVar19 = -0x10;
            plVar7 = (long *)(pcVar19 + 2);
            for (iVar10 = ((int)plVar20 - (int)plVar5) + (int)lVar16 + -0xf; 0xfe < iVar10;
                iVar10 = iVar10 + -0xff) {
              *(char *)((long)plVar7 + -1) = -1;
              plVar7 = (long *)((long)plVar7 + 1);
            }
            *(char *)((long)plVar7 + -1) = (char)iVar10;
          }
          plVar20 = (long *)(uVar17 + (long)plVar7);
          do {
            *plVar7 = *plVar5;
            plVar7 = plVar7 + 1;
            plVar5 = plVar5 + 1;
          } while (plVar7 < plVar20);
          while( true ) {
            *(short *)plVar20 = (short)plVar13 - (short)piVar4;
            uVar14 = LZ4_count((BYTE *)((long)plVar13 + 4),(BYTE *)(piVar4 + 1),
                               (BYTE *)(source + (long)inputSize + -5));
            if (pcVar3 < (char *)((long)plVar20 + (ulong)(uVar14 >> 8) + 8)) {
              return 0;
            }
            pcVar21 = (char *)((long)plVar20 + 2);
            if (uVar14 < 0xf) {
              *pcVar19 = *pcVar19 + (char)uVar14;
              pcVar19 = pcVar21;
            }
            else {
              *pcVar19 = *pcVar19 + '\x0f';
              for (uVar6 = uVar14 - 0xf; 0x1fd < uVar6; uVar6 = uVar6 - 0x1fe) {
                pcVar21[0] = -1;
                pcVar21[1] = -1;
                pcVar21 = pcVar21 + 2;
              }
              if (0xfe < uVar6) {
                uVar6 = uVar6 - 0xff;
                *pcVar21 = -1;
                pcVar21 = pcVar21 + 1;
              }
              *pcVar21 = (char)uVar6;
              pcVar19 = pcVar21 + 1;
            }
            plVar13 = (long *)((long)plVar13 + (ulong)(uVar14 + 4));
            if (source + (long)inputSize + -0xc < plVar13) goto LAB_001681b7;
            *(short *)((long)ctx.table +
                      (ulong)((uint)((ulong)(*(long *)((long)plVar13 + -2) * 0xcf1bbcdcbb) >> 0x1b)
                             & 0x1fff) * 2) = ((short)plVar13 + -2) - sVar1;
            uVar15 = (ulong)((uint)((ulong)(*plVar13 * 0xcf1bbcdcbb) >> 0x1b) & 0x1fff);
            uVar17 = (ulong)*(ushort *)((long)ctx.table + uVar15 * 2);
            piVar4 = (int *)(source + uVar17);
            *(short *)((long)ctx.table + uVar15 * 2) = (short)plVar13 - sVar1;
            plVar5 = plVar13;
            if ((source + uVar17 + 0xffff < plVar13) || (*piVar4 != (int)*plVar13)) break;
            plVar20 = (long *)(pcVar19 + 1);
            *pcVar19 = '\0';
          }
        } while( true );
      }
LAB_001681b7:
      pcVar3 = source + ((long)inputSize - (long)plVar13);
      iVar18 = 0;
      if (pcVar19 + (long)(pcVar3 + ((ulong)(pcVar3 + 0xf0) / 0xff - (long)dest) + 1) <=
          (char *)(ulong)(uint)maxOutputSize) {
        if (pcVar3 < (char *)0xf) {
          *pcVar19 = (char)pcVar3 << 4;
        }
        else {
          *pcVar19 = -0x10;
          for (pcVar21 = pcVar3 + -0xf; pcVar19 = pcVar19 + 1, (char *)0xfe < pcVar21;
              pcVar21 = pcVar21 + -0xff) {
            *pcVar19 = -1;
          }
          *pcVar19 = (char)pcVar21;
        }
        memcpy(pcVar19 + 1,plVar13,(size_t)pcVar3);
        iVar18 = ((int)(pcVar19 + 1) + (int)pcVar3) - local_4078;
      }
    }
  }
  else {
    iVar18 = 0;
    if ((uint)inputSize < 0x7e000001) {
      pcVar19 = dest;
      plVar13 = (long *)source;
LAB_00167f12:
      uVar15 = 1;
      lVar11 = *(long *)((long)plVar13 + 1);
      plVar5 = (long *)((long)plVar13 + 1);
      uVar14 = acceleration << 6;
      while( true ) {
        plVar7 = (long *)(uVar15 + (long)plVar5);
        if (source + ((ulong)(uint)inputSize - 0xc) < plVar7) goto LAB_00168140;
        uVar17 = (ulong)((uint)((ulong)(lVar11 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
        uVar15 = (ulong)*(uint *)((long)ctx.table + uVar17 * 4);
        lVar11 = *plVar7;
        iVar18 = (int)plVar5;
        *(int *)((long)ctx.table + uVar17 * 4) = iVar18 - iVar10;
        if ((plVar5 <= source + uVar15 + 0xffff) &&
           (piVar4 = (int *)(source + uVar15), *piVar4 == (int)*plVar5)) break;
        uVar15 = (ulong)(uVar14 >> 6);
        uVar14 = uVar14 + 1;
        plVar5 = plVar7;
      }
      lVar11 = 0;
      cVar2 = (char)plVar5 * '\x10' + (char)plVar13 * -0x10;
      do {
        cVar9 = cVar2;
        lVar16 = lVar11;
        piVar8 = (int *)((long)piVar4 + lVar16);
        plVar7 = (long *)((long)plVar5 + lVar16);
        if ((plVar7 <= plVar13) || (piVar8 <= source)) break;
        lVar11 = lVar16 + -1;
        cVar2 = cVar9 + -0x10;
      } while (*(char *)((long)plVar5 + lVar16 + -1) == *(char *)((long)piVar4 + lVar16 + -1));
      uVar14 = iVar18 - (int)plVar13;
      uVar15 = (ulong)(uVar14 + (int)lVar16);
      uVar17 = (ulong)uVar14 + lVar16;
      if (pcVar3 < pcVar19 + (uVar17 & 0xffffffff) / 0xff + uVar15 + 9) {
        return 0;
      }
      if ((uint)uVar17 < 0xf) {
        plVar5 = (long *)(pcVar19 + 1);
        *pcVar19 = cVar9;
      }
      else {
        *pcVar19 = -0x10;
        plVar5 = (long *)(pcVar19 + 2);
        for (iVar18 = (iVar18 - (int)plVar13) + (int)lVar16 + -0xf; 0xfe < iVar18;
            iVar18 = iVar18 + -0xff) {
          *(char *)((long)plVar5 + -1) = -1;
          plVar5 = (long *)((long)plVar5 + 1);
        }
        *(char *)((long)plVar5 + -1) = (char)iVar18;
      }
      plVar20 = (long *)(uVar15 + (long)plVar5);
      do {
        *plVar5 = *plVar13;
        plVar5 = plVar5 + 1;
        plVar13 = plVar13 + 1;
        pcVar21 = pcVar19;
      } while (plVar5 < plVar20);
      do {
        *(short *)plVar20 = (short)plVar7 - (short)piVar8;
        uVar14 = LZ4_count((BYTE *)((long)plVar7 + 4),(BYTE *)(piVar8 + 1),
                           (BYTE *)(source + ((ulong)(uint)inputSize - 5)));
        if (pcVar3 < (char *)((long)plVar20 + (ulong)(uVar14 >> 8) + 8)) {
          return 0;
        }
        pcVar19 = (char *)((long)plVar20 + 2);
        if (uVar14 < 0xf) {
          *pcVar21 = *pcVar21 + (char)uVar14;
        }
        else {
          *pcVar21 = *pcVar21 + '\x0f';
          for (uVar6 = uVar14 - 0xf; 0x1fd < uVar6; uVar6 = uVar6 - 0x1fe) {
            pcVar19[0] = -1;
            pcVar19[1] = -1;
            pcVar19 = pcVar19 + 2;
          }
          if (0xfe < uVar6) {
            uVar6 = uVar6 - 0xff;
            *pcVar19 = -1;
            pcVar19 = pcVar19 + 1;
          }
          *pcVar19 = (char)uVar6;
          pcVar19 = pcVar19 + 1;
        }
        plVar13 = (long *)((long)plVar7 + (ulong)(uVar14 + 4));
        if (source + ((ulong)(uint)inputSize - 0xc) < plVar13) {
LAB_00168140:
          pcVar3 = source + ((ulong)(uint)inputSize - (long)plVar13);
          if (pcVar19 + (long)(pcVar3 + ((ulong)(pcVar3 + 0xf0) / 0xff - (long)dest) + 1) <=
              (char *)(ulong)(uint)maxOutputSize) {
            if (pcVar3 < (char *)0xf) {
              *pcVar19 = (char)pcVar3 << 4;
            }
            else {
              *pcVar19 = -0x10;
              for (pcVar21 = pcVar3 + -0xf; pcVar19 = pcVar19 + 1, (char *)0xfe < pcVar21;
                  pcVar21 = pcVar21 + -0xff) {
                *pcVar19 = -1;
              }
              *pcVar19 = (char)pcVar21;
            }
            memcpy(pcVar19 + 1,plVar13,(size_t)pcVar3);
            return ((int)(pcVar19 + 1) + (int)pcVar3) - local_4078;
          }
          return 0;
        }
        *(int *)((long)ctx.table +
                (ulong)((uint)((ulong)(*(long *)((long)plVar13 + -2) * 0xcf1bbcdcbb) >> 0x1c) &
                       0xfff) * 4) = ((int)plVar13 + -2) - iVar10;
        uVar15 = (ulong)((uint)((ulong)(*plVar13 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
        uVar17 = (ulong)*(uint *)((long)ctx.table + uVar15 * 4);
        piVar8 = (int *)(source + uVar17);
        *(int *)((long)ctx.table + uVar15 * 4) = (int)plVar13 - iVar10;
        if ((source + uVar17 + 0xffff < plVar13) || (*piVar8 != (int)*plVar13)) goto LAB_00167f12;
        plVar20 = (long *)(pcVar19 + 1);
        *pcVar19 = '\0';
        pcVar21 = pcVar19;
        plVar7 = plVar13;
      } while( true );
    }
  }
  return iVar18;
}

Assistant:

int LZ4_compress_fast_force(const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    LZ4_stream_t ctx;

    LZ4_resetStream(&ctx);

    if (inputSize < LZ4_64Klimit)
        return LZ4_compress_generic(&ctx, source, dest, inputSize, maxOutputSize, limitedOutput, byU16,                        noDict, noDictIssue, acceleration);
    else
        return LZ4_compress_generic(&ctx, source, dest, inputSize, maxOutputSize, limitedOutput, LZ4_64bits() ? byU32 : byPtr, noDict, noDictIssue, acceleration);
}